

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

TFad<6,_double> * __thiscall TPZTensor<TFad<6,_double>_>::Det(TPZTensor<TFad<6,_double>_> *this)

{
  TFad<6,_double> *pTVar1;
  TFad<6,_double> *pTVar2;
  TFad<6,_double> *fadexpr;
  long in_RSI;
  TFad<6,_double> *in_RDI;
  TPZVec<TFad<6,_double>_> *this_00;
  TFad<6,_double> *in_stack_fffffffffffffe90;
  TFad<6,_double> *in_stack_fffffffffffffe98;
  
  this_00 = (TPZVec<TFad<6,_double>_> *)(in_RSI + 8);
  TPZVec<TFad<6,_double>_>::operator[](this_00,0);
  TPZVec<TFad<6,_double>_>::operator[](this_00,3);
  ::operator*(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  TPZVec<TFad<6,_double>_>::operator[](this_00,5);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),1);
  pTVar1 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),2);
  ::operator*(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  pTVar2 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),4);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  ::operator*((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)pTVar1,(value_type *)pTVar2);
  ::operator+((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)in_stack_fffffffffffffe98,
              (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)in_stack_fffffffffffffe90);
  pTVar1 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),2);
  pTVar2 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),3);
  ::operator*(pTVar1,pTVar2);
  fadexpr = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),2);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)pTVar1,pTVar2);
  ::operator-((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)pTVar1,
              (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)pTVar2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),1);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),1);
  ::operator*(pTVar1,pTVar2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),5);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)pTVar1,pTVar2);
  ::operator-((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)pTVar1,
              (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)pTVar2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),4);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),4);
  ::operator*(pTVar1,pTVar2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),0);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)pTVar1,pTVar2);
  ::operator-((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)pTVar1,
              (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)pTVar2);
  TFad<6,double>::
  TFad<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>,TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>,TFadCst<double>>>>>,TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>>>
            (pTVar2,(TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
                     *)fadexpr);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)0x14b9584);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b9591);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b959e);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)0x14b95ab);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b95b8);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b95c5);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)0x14b95d2);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b95df);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b95ec);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
               *)0x14b95f9);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
               *)0x14b9606);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b9613);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b9620);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b962d);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b963a);
  return in_RDI;
}

Assistant:

T TPZTensor<T>::Det() const {
    return fData[_XX_] * fData[_YY_] * fData[_ZZ_] + fData[_XY_] * fData[_XZ_] * fData[_YZ_]*2. - fData[_XZ_] * fData[_YY_] * fData[_XZ_] -
            fData[_XY_] * fData[_XY_] * fData[_ZZ_] - fData[_YZ_] * fData[_YZ_] * fData[_XX_];
}